

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O0

void ngx_http_upstream_send_request
               (ngx_http_request_t *r,ngx_http_upstream_t *u,ngx_uint_t do_write)

{
  ngx_connection_t *c_00;
  ngx_log_t *log;
  int iVar1;
  ngx_int_t nVar2;
  int *piVar3;
  ngx_connection_t *c;
  ngx_int_t rc;
  ngx_uint_t do_write_local;
  ngx_http_upstream_t *u_local;
  ngx_http_request_t *r_local;
  
  c_00 = (u->peer).connection;
  if ((c_00->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,c_00->log,0,"http upstream send request");
  }
  if (u->state->connect_time == 0xffffffffffffffff) {
    u->state->connect_time = ngx_current_msec - u->state->response_time;
  }
  if (((*(ushort *)&u->field_0x3e8 >> 10 & 1) == 0) &&
     (nVar2 = ngx_http_upstream_test_connect(c_00), nVar2 != 0)) {
    ngx_http_upstream_next(r,u,2);
  }
  else {
    c_00->log->action = "sending request to upstream";
    nVar2 = ngx_http_upstream_send_request_body(r,u,do_write);
    if (nVar2 == -1) {
      ngx_http_upstream_next(r,u,2);
    }
    else if (nVar2 < 300) {
      if (nVar2 == -2) {
        if ((*(uint *)&c_00->write->field_0x8 >> 5 & 1) == 0) {
          ngx_event_add_timer(c_00->write,u->conf->send_timeout);
        }
        else if ((*(uint *)&c_00->write->field_0x8 >> 0xb & 1) != 0) {
          ngx_event_del_timer(c_00->write);
        }
        nVar2 = ngx_handle_write_event(c_00->write,u->conf->send_lowat);
        if (nVar2 != 0) {
          ngx_http_upstream_finalize_request(r,u,500);
        }
      }
      else {
        *(ushort *)&u->field_0x3e8 = *(ushort *)&u->field_0x3e8 & 0xf7ff | 0x800;
        if ((*(uint *)&c_00->write->field_0x8 >> 0xb & 1) != 0) {
          ngx_event_del_timer(c_00->write);
        }
        if ((*(uint *)&c_00->field_0xd8 >> 0x16 & 3) == 1) {
          iVar1 = ngx_tcp_push(c_00->fd);
          if (iVar1 == -1) {
            if (2 < c_00->log->log_level) {
              log = c_00->log;
              piVar3 = __errno_location();
              ngx_log_error_core(3,log,*piVar3,"setsockopt(!TCP_CORK) failed");
            }
            ngx_http_upstream_finalize_request(r,u,500);
            return;
          }
          *(uint *)&c_00->field_0xd8 = *(uint *)&c_00->field_0xd8 & 0xff3fffff;
        }
        u->write_event_handler = ngx_http_upstream_dummy_handler;
        nVar2 = ngx_handle_write_event(c_00->write,0);
        if (nVar2 == 0) {
          ngx_event_add_timer(c_00->read,u->conf->read_timeout);
          if ((*(uint *)&c_00->read->field_0x8 >> 5 & 1) != 0) {
            ngx_http_upstream_process_header(r,u);
          }
        }
        else {
          ngx_http_upstream_finalize_request(r,u,500);
        }
      }
    }
    else {
      ngx_http_upstream_finalize_request(r,u,nVar2);
    }
  }
  return;
}

Assistant:

static void
ngx_http_upstream_send_request(ngx_http_request_t *r, ngx_http_upstream_t *u,
    ngx_uint_t do_write)
{
    ngx_int_t          rc;
    ngx_connection_t  *c;

    c = u->peer.connection;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http upstream send request");

    if (u->state->connect_time == (ngx_msec_t) -1) {
        u->state->connect_time = ngx_current_msec - u->state->response_time;
    }

    if (!u->request_sent && ngx_http_upstream_test_connect(c) != NGX_OK) {
        ngx_http_upstream_next(r, u, NGX_HTTP_UPSTREAM_FT_ERROR);
        return;
    }

    c->log->action = "sending request to upstream";

    rc = ngx_http_upstream_send_request_body(r, u, do_write);

    if (rc == NGX_ERROR) {
        ngx_http_upstream_next(r, u, NGX_HTTP_UPSTREAM_FT_ERROR);
        return;
    }

    if (rc >= NGX_HTTP_SPECIAL_RESPONSE) {
        ngx_http_upstream_finalize_request(r, u, rc);
        return;
    }

    if (rc == NGX_AGAIN) {
        if (!c->write->ready) {
            ngx_add_timer(c->write, u->conf->send_timeout);

        } else if (c->write->timer_set) {
            ngx_del_timer(c->write);
        }

        if (ngx_handle_write_event(c->write, u->conf->send_lowat) != NGX_OK) {
            ngx_http_upstream_finalize_request(r, u,
                                               NGX_HTTP_INTERNAL_SERVER_ERROR);
            return;
        }

        return;
    }

    /* rc == NGX_OK */

    u->request_body_sent = 1;

    if (c->write->timer_set) {
        ngx_del_timer(c->write);
    }

    if (c->tcp_nopush == NGX_TCP_NOPUSH_SET) {
        if (ngx_tcp_push(c->fd) == NGX_ERROR) {
            ngx_log_error(NGX_LOG_CRIT, c->log, ngx_socket_errno,
                          ngx_tcp_push_n " failed");
            ngx_http_upstream_finalize_request(r, u,
                                               NGX_HTTP_INTERNAL_SERVER_ERROR);
            return;
        }

        c->tcp_nopush = NGX_TCP_NOPUSH_UNSET;
    }

    u->write_event_handler = ngx_http_upstream_dummy_handler;

    if (ngx_handle_write_event(c->write, 0) != NGX_OK) {
        ngx_http_upstream_finalize_request(r, u,
                                           NGX_HTTP_INTERNAL_SERVER_ERROR);
        return;
    }

    ngx_add_timer(c->read, u->conf->read_timeout);

    if (c->read->ready) {
        ngx_http_upstream_process_header(r, u);
        return;
    }
}